

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

int F(opt_state_t *opt_state,int code,int v0,int v1)

{
  int iVar1;
  vmapinfo *pvVar2;
  int iVar3;
  valnode *pvVar4;
  uint uVar5;
  
  uVar5 = (uint)(v1 << 8 ^ v0 << 4 ^ code) % 0xd5;
  pvVar4 = opt_state->hashtbl[uVar5];
  while( true ) {
    if (pvVar4 == (valnode *)0x0) {
      iVar1 = opt_state->curval;
      iVar3 = iVar1 + 1;
      opt_state->curval = iVar3;
      if ((code & 0xe6U) == 0) {
        pvVar2 = opt_state->vmap;
        pvVar2[(long)iVar1 + 1].const_val = v0;
        pvVar2[(long)iVar1 + 1].is_const = 1;
      }
      pvVar4 = opt_state->next_vnode;
      opt_state->next_vnode = pvVar4 + 1;
      pvVar4->val = iVar3;
      pvVar4->code = code;
      pvVar4->v0 = v0;
      pvVar4->v1 = v1;
      pvVar4->next = opt_state->hashtbl[uVar5];
      opt_state->hashtbl[uVar5] = pvVar4;
      return iVar3;
    }
    if (((pvVar4->code == code) && (pvVar4->v0 == v0)) && (pvVar4->v1 == v1)) break;
    pvVar4 = pvVar4->next;
  }
  return pvVar4->val;
}

Assistant:

static int
F(opt_state_t *opt_state, int code, int v0, int v1)
{
	u_int hash;
	int val;
	struct valnode *p;

	hash = (u_int)code ^ (v0 << 4) ^ (v1 << 8);
	hash %= MODULUS;

	for (p = opt_state->hashtbl[hash]; p; p = p->next)
		if (p->code == code && p->v0 == v0 && p->v1 == v1)
			return p->val;

	val = ++opt_state->curval;
	if (BPF_MODE(code) == BPF_IMM &&
	    (BPF_CLASS(code) == BPF_LD || BPF_CLASS(code) == BPF_LDX)) {
		opt_state->vmap[val].const_val = v0;
		opt_state->vmap[val].is_const = 1;
	}
	p = opt_state->next_vnode++;
	p->val = val;
	p->code = code;
	p->v0 = v0;
	p->v1 = v1;
	p->next = opt_state->hashtbl[hash];
	opt_state->hashtbl[hash] = p;

	return val;
}